

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::texture_size_invalid_lod
               (NegativeTestContext *ctx)

{
  ShaderType shaderType;
  DataType DVar1;
  bool bVar2;
  ContextType CVar3;
  char *pcVar4;
  ostream *poVar5;
  undefined4 *puVar6;
  DataType dataType;
  DataType dataType_00;
  long lVar7;
  NegativeTestContext *this;
  allocator<char> local_30a;
  allocator<char> local_309;
  ShaderType local_308;
  DataType local_304;
  NegativeTestContext *local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  long local_2d8;
  long local_2d0;
  string local_2c8;
  string shaderSource;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  ostringstream source;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&source,"textureSize: Invalid lod type.",(allocator<char> *)&local_2f8);
  NegativeTestContext::beginSection(ctx,(string *)&source);
  std::__cxx11::string::~string((string *)&source);
  lVar7 = 0;
  local_300 = ctx;
  do {
    if (lVar7 == 6) {
      NegativeTestContext::endSection(local_300);
      return;
    }
    shaderType = (&NegativeTestShared::(anonymous_namespace)::s_shaders)[lVar7];
    bVar2 = NegativeTestContext::isShaderSupported(local_300,shaderType);
    if (bVar2) {
      local_308 = shaderType;
      local_2d8 = lVar7;
      pcVar4 = glu::getShaderTypeName(shaderType);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2f8,pcVar4,(allocator<char> *)&local_2c8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&source,
                     "Verify shader: ",&local_2f8);
      this = local_300;
      NegativeTestContext::beginSection
                (local_300,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&source);
      std::__cxx11::string::~string((string *)&source);
      std::__cxx11::string::~string((string *)&local_2f8);
      lVar7 = 0;
      while (lVar7 != 0x1c) {
        CVar3.super_ApiType.m_bits = (ApiType)(*this->m_renderCtx->_vptr_RenderContext[2])();
        bVar2 = glu::contextSupports(CVar3,(ApiType)0x23);
        puVar6 = &NegativeTestShared::(anonymous_namespace)::s_samplerTypes;
        DVar1 = (&NegativeTestShared::(anonymous_namespace)::s_samplerTypes)[lVar7];
        local_2d0 = lVar7;
        if (bVar2) {
LAB_013599d9:
          local_304 = DVar1;
          pcVar4 = glu::getDataTypeName(DVar1);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2f8,pcVar4,(allocator<char> *)&local_2c8);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &source,"Verify sampler/lod data type",&local_2f8);
          NegativeTestContext::beginSection
                    (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &source);
          std::__cxx11::string::~string((string *)&source);
          std::__cxx11::string::~string((string *)&local_2f8);
          for (lVar7 = 0; lVar7 != 0x2c; lVar7 = lVar7 + 4) {
            DVar1 = *(DataType *)
                     ((long)&NegativeTestShared::(anonymous_namespace)::s_nonScalarIntTypes + lVar7)
            ;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&source);
            CVar3.super_ApiType.m_bits = (ApiType)(*this->m_renderCtx->_vptr_RenderContext[2])();
            bVar2 = glu::contextSupports(CVar3,(ApiType)0x23);
            pcVar4 = glu::getGLSLVersionDeclaration(bVar2 | GLSL_VERSION_310_ES);
            poVar5 = std::operator<<((ostream *)&source,pcVar4);
            poVar5 = std::operator<<(poVar5,"\n");
            NegativeTestShared::(anonymous_namespace)::getDataTypeExtension_abi_cxx11_
                      (&local_2c8,(_anonymous_namespace_ *)(ulong)local_304,dataType_00);
            getShaderExtensionDeclaration(&local_2f8,&local_2c8);
            poVar5 = std::operator<<(poVar5,(string *)&local_2f8);
            NegativeTestShared::(anonymous_namespace)::getShaderInitialization_abi_cxx11_
                      (&local_208,(_anonymous_namespace_ *)local_300,
                       (NegativeTestContext *)(ulong)local_308,(ShaderType)puVar6);
            poVar5 = std::operator<<(poVar5,(string *)&local_208);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_248,"sampler",&local_309);
            declareShaderUniform(&local_228,local_304,&local_248);
            poVar5 = std::operator<<(poVar5,(string *)&local_228);
            poVar5 = std::operator<<(poVar5,"void main(void)\n");
            poVar5 = std::operator<<(poVar5,"{\n");
            poVar5 = std::operator<<(poVar5,"    ");
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_288,"lod",&local_30a);
            declareAndInitializeShaderVariable(&local_268,DVar1,&local_288);
            poVar5 = std::operator<<(poVar5,(string *)&local_268);
            poVar5 = std::operator<<(poVar5,"    textureSize(sampler, lod);\n");
            std::operator<<(poVar5,"}\n");
            std::__cxx11::string::~string((string *)&local_268);
            std::__cxx11::string::~string((string *)&local_288);
            std::__cxx11::string::~string((string *)&local_228);
            std::__cxx11::string::~string((string *)&local_248);
            std::__cxx11::string::~string((string *)&local_208);
            std::__cxx11::string::~string((string *)&local_2f8);
            std::__cxx11::string::~string((string *)&local_2c8);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&source);
            std::__cxx11::string::string((string *)&local_1e8,(string *)&shaderSource);
            this = local_300;
            verifyShader(local_300,local_308,&local_1e8);
            std::__cxx11::string::~string((string *)&local_1e8);
            std::__cxx11::string::~string((string *)&shaderSource);
          }
          NegativeTestContext::endSection(this);
        }
        else {
          NegativeTestShared::(anonymous_namespace)::getDataTypeExtension_abi_cxx11_
                    (&local_1c8,(_anonymous_namespace_ *)(ulong)DVar1,dataType);
          bVar2 = NegativeTestContext::isExtensionSupported(this,&local_1c8);
          std::__cxx11::string::~string((string *)&local_1c8);
          if (bVar2) goto LAB_013599d9;
        }
        lVar7 = local_2d0 + 1;
      }
      NegativeTestContext::endSection(this);
      lVar7 = local_2d8;
    }
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

void texture_size_invalid_lod (NegativeTestContext& ctx)
{
	ctx.beginSection("textureSize: Invalid lod type.");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_samplerTypes); ++dataTypeNdx)
			{
				if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.isExtensionSupported(getDataTypeExtension(s_samplerTypes[dataTypeNdx])))
				{
					ctx.beginSection("Verify sampler/lod data type" + std::string(getDataTypeName(s_samplerTypes[dataTypeNdx])));
					for (int dataTypeNdx2 = 0; dataTypeNdx2 < DE_LENGTH_OF_ARRAY(s_nonScalarIntTypes); ++dataTypeNdx2)
					{
						if (s_nonScalarIntTypes[dataTypeNdx2] == glu::TYPE_INT)
							continue;

						const std::string shaderSource(genShaderSourceTextureSize_lod(ctx, s_shaders[shaderNdx], s_samplerTypes[dataTypeNdx], s_nonScalarIntTypes[dataTypeNdx2]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					ctx.endSection();
				}
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}